

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound_linux_alsa.cpp
# Opt level: O3

void __thiscall
YsSoundPlayer::APISpecificData::PopulateWriteBuffer
          (APISpecificData *this,uint *writeBufFilledInNStep,uint wavPtr,SoundData *wavFile,
          YSBOOL loop,int nThSound)

{
  uint uVar1;
  uchar *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uchar *puVar7;
  uint uVar8;
  uchar uVar9;
  int iVar10;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar11;
  
  uVar1 = *writeBufFilledInNStep;
  *writeBufFilledInNStep = 0;
  do {
    uVar6 = *writeBufFilledInNStep;
    if (this->bufSizeInNStep <= uVar6) goto LAB_0011359e;
    puVar7 = SoundData::DataPointerAtTimeStep(wavFile,wavPtr);
    uVar6 = this->bytePerTimeStep;
    uVar4 = SoundData::SizeInByte(wavFile);
    uVar4 = uVar4 - uVar6 * wavPtr;
    uVar6 = this->bytePerTimeStep;
    uVar15 = *writeBufFilledInNStep;
    uVar8 = (this->bufSizeInNStep - uVar15) * uVar6;
    if ((int)uVar4 < (int)uVar8) {
      uVar8 = uVar4;
    }
    if (1 < (int)uVar8) {
      uVar12 = 0;
      do {
        uVar6 = *writeBufFilledInNStep;
        uVar15 = this->bytePerTimeStep;
        uVar4 = (uint)uVar12;
        if ((nThSound == 0) || (uVar1 < (int)((uVar12 & 0xffffffff) / (ulong)uVar15) + uVar6)) {
          this->writeBuf[uVar15 * uVar6 + uVar4] = puVar7[uVar12];
          uVar5 = uVar4 | 1;
          uVar9 = puVar7[uVar12 + 1];
        }
        else {
          uVar5 = (uint)CONCAT11(puVar7[uVar12 + 1],puVar7[uVar12]);
          uVar3 = uVar5 | 0xffff0000;
          if (-1 < (char)puVar7[uVar12 + 1]) {
            uVar3 = uVar5;
          }
          uVar5 = uVar4 + 1;
          puVar2 = this->writeBuf;
          uVar13 = uVar4 + uVar15 * uVar6;
          uVar14 = (uint)CONCAT11(puVar2[uVar15 * uVar6 + uVar4 + 1],puVar2[uVar13]);
          uVar11 = uVar14 | 0xffff0000;
          if (-1 < (char)puVar2[uVar15 * uVar6 + uVar4 + 1]) {
            uVar11 = uVar14;
          }
          iVar10 = uVar11 + uVar3;
          if (0x7ffe < iVar10) {
            iVar10 = 0x7fff;
          }
          if (iVar10 < -0x7fff) {
            iVar10 = -0x8000;
          }
          puVar2[uVar13] = (uchar)iVar10;
          uVar9 = (uchar)((uint)iVar10 >> 8);
        }
        this->writeBuf[uVar5 + this->bytePerTimeStep * *writeBufFilledInNStep] = uVar9;
        uVar12 = uVar12 + 2;
      } while (uVar12 <= uVar8 - 2);
      uVar6 = this->bytePerTimeStep;
      uVar15 = *writeBufFilledInNStep;
    }
    *writeBufFilledInNStep = uVar8 / uVar6 + uVar15;
    uVar15 = uVar8 / this->bytePerTimeStep + wavPtr;
    uVar6 = SoundData::NTimeStep(wavFile);
    wavPtr = uVar15;
    if (loop == YSTRUE) {
      wavPtr = 0;
    }
    if (uVar15 < uVar6) {
      wavPtr = uVar15;
    }
  } while ((loop == YSTRUE) || (uVar15 < uVar6));
  uVar6 = *writeBufFilledInNStep;
LAB_0011359e:
  if (uVar6 < uVar1) {
    *writeBufFilledInNStep = uVar1;
  }
  return;
}

Assistant:

void YsSoundPlayer::APISpecificData::PopulateWriteBuffer(unsigned int &writeBufFilledInNStep,unsigned int wavPtr,const SoundData *wavFile,YSBOOL loop,int nThSound)
{
	auto currentFilledInNStep=writeBufFilledInNStep;
	writeBufFilledInNStep=0;
	while(writeBufFilledInNStep<bufSizeInNStep)
	{
		const unsigned char *dataPtr=wavFile->DataPointerAtTimeStep(wavPtr);
		const int ptrInByte=wavPtr*bytePerTimeStep;
		const int wavByteLeft=wavFile->SizeInByte()-ptrInByte;
		const int writeBufLeftInByte=(bufSizeInNStep-writeBufFilledInNStep)*bytePerTimeStep;
		
		int nByteToWrite;
		if(wavByteLeft<writeBufLeftInByte)
		{
			nByteToWrite=wavByteLeft;
		}
		else
		{
			nByteToWrite=writeBufLeftInByte;
		}

		for(int i=0; i<=nByteToWrite-2; i+=2)
		{
			if(0==nThSound || currentFilledInNStep<writeBufFilledInNStep+i/bytePerTimeStep)
			{
				writeBuf[writeBufFilledInNStep*bytePerTimeStep+i  ]=dataPtr[i];
				writeBuf[writeBufFilledInNStep*bytePerTimeStep+i+1]=dataPtr[i+1];
			}
			else
			{
				int v=(int)dataPtr[i]+(((int)dataPtr[i+1])<<8);
				if(32768<=v)
				{
					v-=65536;
				}
				int c=  (int)writeBuf[writeBufFilledInNStep*bytePerTimeStep+i]
				     +(((int)writeBuf[writeBufFilledInNStep*bytePerTimeStep+i+1])<<8);
				if(32768<=c)
				{
					c-=65536;
				}
				v+=c;
				if(32767<v)
				{
					v=32767;
				}
				if(v<-32768)
				{
					v=-32768;
				}
				writeBuf[writeBufFilledInNStep*bytePerTimeStep+i  ]=v&0xff;
				writeBuf[writeBufFilledInNStep*bytePerTimeStep+i+1]=((v>>8)&0xff);
			}
		}
		writeBufFilledInNStep+=nByteToWrite/bytePerTimeStep;
		wavPtr+=nByteToWrite/bytePerTimeStep;
		if(wavFile->NTimeStep()<=wavPtr)
		{
			if(YSTRUE!=loop)
			{
				break;
			}
			wavPtr=0;
		}
	}

	if(writeBufFilledInNStep<currentFilledInNStep)
	{
		writeBufFilledInNStep=currentFilledInNStep;
	}
}